

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scattering.h
# Opt level: O3

SampledSpectrum pbrt::FrConductor(Float cosTheta_i,SampledSpectrum *eta,SampledSpectrum *k)

{
  undefined8 uVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  int i;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar12;
  float fVar18;
  undefined1 in_register_00001204 [60];
  undefined1 auVar17 [64];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  SampledSpectrum SVar25;
  SampledSpectrum ret_1;
  undefined1 local_78 [8];
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [8];
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [8];
  float fStack_30;
  float fStack_2c;
  undefined1 local_28 [16];
  float local_18 [4];
  undefined1 auVar16 [16];
  
  auVar17._4_60_ = in_register_00001204;
  auVar17._0_4_ = cosTheta_i;
  lVar10 = 0;
  auVar16 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar17._0_16_);
  uVar1 = vcmpss_avx512f(auVar17._0_16_,SUB6416(ZEXT464(0xbf800000),0),1);
  bVar2 = (bool)((byte)uVar1 & 1);
  local_28._4_12_ = auVar16._4_12_;
  local_28._0_4_ = (uint)bVar2 * -0x40800000 + (uint)!bVar2 * auVar16._0_4_;
  fVar18 = (k->values).values[0];
  fVar3 = (k->values).values[1];
  fVar4 = (k->values).values[2];
  fVar5 = (k->values).values[3];
  fVar6 = (eta->values).values[0];
  fVar7 = (eta->values).values[1];
  fVar8 = (eta->values).values[2];
  fVar9 = (eta->values).values[3];
  fVar12 = 1.0 - (float)local_28._0_4_ * (float)local_28._0_4_;
  local_58 = ZEXT416((uint)((float)local_28._0_4_ * (float)local_28._0_4_));
  local_48 = ZEXT416((uint)fVar12);
  local_38._4_4_ = fVar12;
  local_38._0_4_ = fVar12;
  fStack_30 = fVar12;
  fStack_2c = fVar12;
  auVar20._0_4_ = fVar6 * fVar6;
  auVar20._4_4_ = fVar7 * fVar7;
  auVar20._8_4_ = fVar8 * fVar8;
  auVar20._12_4_ = fVar9 * fVar9;
  auVar13._0_4_ = fVar18 * fVar18;
  auVar13._4_4_ = fVar3 * fVar3;
  auVar13._8_4_ = fVar4 * fVar4;
  auVar13._12_4_ = fVar5 * fVar5;
  auVar16 = vsubps_avx(auVar20,auVar13);
  auVar11._8_4_ = 0x40800000;
  auVar11._0_8_ = 0x4080000040800000;
  auVar11._12_4_ = 0x40800000;
  auVar11 = vmulps_avx512vl(auVar20,auVar11);
  _local_68 = vsubps_avx(auVar16,_local_38);
  local_18[0] = auVar13._0_4_ * auVar11._0_4_ + local_68._0_4_ * local_68._0_4_;
  local_18[1] = auVar13._4_4_ * auVar11._4_4_ + local_68._4_4_ * local_68._4_4_;
  local_18[2] = auVar13._8_4_ * auVar11._8_4_ + local_68._8_4_ * local_68._8_4_;
  local_18[3] = auVar13._12_4_ * auVar11._12_4_ + local_68._12_4_ * local_68._12_4_;
  _local_78 = ZEXT416(0) << 0x20;
  do {
    fVar12 = local_18[lVar10];
    if (fVar12 < 0.0) {
      fVar12 = sqrtf(fVar12);
    }
    else {
      auVar16 = vsqrtss_avx(ZEXT416((uint)fVar12),ZEXT416((uint)fVar12));
      fVar12 = auVar16._0_4_;
    }
    *(float *)(local_78 + lVar10 * 4) = fVar12;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 4);
  auVar21._0_4_ = (float)local_58._0_4_ + (float)local_78._0_4_;
  auVar21._4_4_ = (float)local_58._0_4_ + (float)local_78._4_4_;
  auVar21._8_4_ = (float)local_58._0_4_ + fStack_70;
  auVar21._12_4_ = (float)local_58._0_4_ + fStack_6c;
  auVar16._0_4_ = ((float)local_78._0_4_ + (float)local_68._0_4_) * 0.5;
  auVar16._4_4_ = ((float)local_78._4_4_ + (float)local_68._4_4_) * 0.5;
  auVar16._8_4_ = (fStack_70 + fStack_60) * 0.5;
  auVar16._12_4_ = (fStack_6c + fStack_5c) * 0.5;
  auVar16 = vmaxps_avx(auVar16,ZEXT816(0) << 0x40);
  auVar16 = vsqrtps_avx(auVar16);
  fVar12 = (float)local_48._0_4_ * (float)local_48._0_4_;
  local_28._0_4_ = (float)local_28._0_4_ + (float)local_28._0_4_;
  auVar14._0_4_ = fVar12 + (float)local_58._0_4_ * (float)local_78._0_4_;
  auVar14._4_4_ = fVar12 + (float)local_58._0_4_ * (float)local_78._4_4_;
  auVar14._8_4_ = fVar12 + (float)local_58._0_4_ * fStack_70;
  auVar14._12_4_ = fVar12 + (float)local_58._0_4_ * fStack_6c;
  auVar23._0_4_ = (float)local_28._0_4_ * auVar16._0_4_;
  auVar23._4_4_ = (float)local_28._0_4_ * auVar16._4_4_;
  auVar23._8_4_ = (float)local_28._0_4_ * auVar16._8_4_;
  auVar23._12_4_ = (float)local_28._0_4_ * auVar16._12_4_;
  auVar19._0_4_ = auVar23._0_4_ * (float)local_38._0_4_;
  auVar19._4_4_ = auVar23._4_4_ * (float)local_38._4_4_;
  auVar19._8_4_ = auVar23._8_4_ * fStack_30;
  auVar19._12_4_ = auVar23._12_4_ * fStack_2c;
  auVar16 = vsubps_avx(auVar21,auVar23);
  auVar22._0_4_ = auVar23._0_4_ + auVar21._0_4_;
  auVar22._4_4_ = auVar23._4_4_ + auVar21._4_4_;
  auVar22._8_4_ = auVar23._8_4_ + auVar21._8_4_;
  auVar22._12_4_ = auVar23._12_4_ + auVar21._12_4_;
  auVar16 = vdivps_avx(auVar16,auVar22);
  auVar11 = vsubps_avx(auVar14,auVar19);
  auVar15._0_4_ = auVar19._0_4_ + auVar14._0_4_;
  auVar15._4_4_ = auVar19._4_4_ + auVar14._4_4_;
  auVar15._8_4_ = auVar19._8_4_ + auVar14._8_4_;
  auVar15._12_4_ = auVar19._12_4_ + auVar14._12_4_;
  auVar24._0_4_ = auVar11._0_4_ * auVar16._0_4_;
  auVar24._4_4_ = auVar11._4_4_ * auVar16._4_4_;
  auVar24._8_4_ = auVar11._8_4_ * auVar16._8_4_;
  auVar24._12_4_ = auVar11._12_4_ * auVar16._12_4_;
  auVar11 = vdivps_avx(auVar24,auVar15);
  fVar12 = (auVar16._0_4_ + auVar11._0_4_) * 0.5;
  fVar18 = (auVar16._4_4_ + auVar11._4_4_) * 0.5;
  auVar16 = CONCAT412((auVar16._12_4_ + auVar11._12_4_) * 0.5,
                      CONCAT48((auVar16._8_4_ + auVar11._8_4_) * 0.5,CONCAT44(fVar18,fVar12)));
  auVar16 = vshufpd_avx(auVar16,auVar16,1);
  SVar25.values.values._8_8_ = auVar16._0_8_;
  SVar25.values.values[0] = fVar12;
  SVar25.values.values[1] = fVar18;
  return (SampledSpectrum)SVar25.values.values;
}

Assistant:

PBRT_CPU_GPU
inline SampledSpectrum FrConductor(Float cosTheta_i, const SampledSpectrum &eta,
                                   const SampledSpectrum &k) {
    cosTheta_i = Clamp(cosTheta_i, -1, 1);
    SampledSpectrum etak = k;

    Float cos2Theta_i = cosTheta_i * cosTheta_i;
    Float sin2Theta_i = 1 - cos2Theta_i;
    SampledSpectrum eta2 = eta * eta;
    SampledSpectrum etak2 = etak * etak;

    SampledSpectrum t0 = eta2 - etak2 - SampledSpectrum(sin2Theta_i);
    SampledSpectrum a2plusb2 = Sqrt(t0 * t0 + 4 * eta2 * etak2);
    SampledSpectrum t1 = a2plusb2 + SampledSpectrum(cos2Theta_i);
    SampledSpectrum a = SafeSqrt(0.5f * (a2plusb2 + t0));
    SampledSpectrum t2 = (Float)2 * cosTheta_i * a;
    SampledSpectrum Rs = (t1 - t2) / (t1 + t2);

    SampledSpectrum t3 =
        cos2Theta_i * a2plusb2 + SampledSpectrum(sin2Theta_i * sin2Theta_i);
    SampledSpectrum t4 = t2 * sin2Theta_i;
    SampledSpectrum Rp = Rs * (t3 - t4) / (t3 + t4);

    return 0.5f * (Rp + Rs);
}